

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O1

plutovg_color_t resolve_current_color(render_context_t *context,element_t *element)

{
  color_t color;
  plutovg_color_t value;
  color_t local_30;
  plutovg_color_t local_28;
  
  local_30.type = color_type_current;
  local_30.value = 0;
  parse_color(element,4,&local_30,true);
  if (local_30.type == color_type_fixed) {
    plutovg_color_init_argb32(&local_28,local_30.value);
  }
  else if (element->parent == (element_t *)0x0) {
    if (context->current_color == (plutovg_color_t *)0x0) {
      local_28 = (plutovg_color_t)(ZEXT816(0x3f80000000000000) << 0x40);
    }
    else {
      local_28 = *context->current_color;
    }
  }
  else {
    local_28 = resolve_current_color(context,element->parent);
  }
  return local_28;
}

Assistant:

static plutovg_color_t resolve_current_color(const render_context_t* context, const element_t* element)
{
    color_t color = {color_type_current};
    parse_color(element, ATTR_COLOR, &color, true);
    if(color.type == color_type_fixed)
        return convert_color(&color);
    if(element->parent == NULL) {
        if(context->current_color)
            return *context->current_color;
        return PLUTOVG_BLACK_COLOR;
    }

    return resolve_current_color(context, element->parent);
}